

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::expect_semicolon_allow_insertion(parser *this,char *func,int line)

{
  token_type tVar1;
  socklen_t *in_RCX;
  undefined1 local_70 [92];
  int line_local;
  char *func_local;
  parser *this_local;
  
  local_70._84_4_ = line;
  unique0x100000d9 = func;
  func_local = (char *)this;
  if ((((this->line_break_skipped_ & 1U) == 0) &&
      (tVar1 = current_token_type(this), tVar1 != rbrace)) &&
     (tVar1 = current_token_type(this), tVar1 != eof)) {
    expect((token *)(local_70 + 0x28),this,semicolon,(char *)stack0xffffffffffffffe8,local_70._84_4_
          );
    token::~token((token *)(local_70 + 0x28));
    return;
  }
  accept((parser *)local_70,(int)this,(sockaddr *)0x34,in_RCX);
  token::~token((token *)local_70);
  return;
}

Assistant:

void expect_semicolon_allow_insertion(const char* func, int line) {
        //
        // Automatic semi-colon insertion
        //
        if (!line_break_skipped_ && current_token_type() != token_type::rbrace && current_token_type() != token_type::eof) {
            expect(token_type::semicolon, func, line);
        } else {
            accept(token_type::semicolon);
        }
    }